

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hash_set_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashSet_LazyEmplaceL_Test::TestBody
          (ParallelFlatHashSet_LazyEmplaceL_Test *this)

{
  slot_type *psVar1;
  size_t in_RCX;
  UniqueLock *in_R8;
  UniqueLock *mutexlock;
  char *message;
  key_equal *in_R9;
  initializer_list<phmap::priv::(anonymous_namespace)::Entry> iVar2;
  tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>::Inner_*,_unsigned_long,_bool>
  res;
  Set m;
  key_arg<phmap::priv::(anonymous_namespace)::Entry> in_stack_fffffffffffffca8;
  Entry local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_348;
  int local_33c;
  iterator local_338;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  local_308;
  
  local_338.inner_ = (Inner *)0x700000001;
  local_338.inner_end_ = (Inner *)0x900000002;
  iVar2._M_len = 2;
  iVar2._M_array = (iterator)&local_338;
  parallel_flat_hash_set<phmap::priv::(anonymous_namespace)::Entry,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>,_4UL,_phmap::NullMutex>
  ::parallel_hash_set((parallel_flat_hash_set<phmap::priv::(anonymous_namespace)::Entry,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>,_4UL,_phmap::NullMutex>
                       *)&local_308,iVar2,in_RCX,(hasher *)in_R8,in_R9,
                      (allocator_type *)in_stack_fffffffffffffca8);
  local_350.key = 5;
  local_350.value = 0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::find_or_prepare_insert_with_hash<phmap::priv::(anonymous_namespace)::Entry>
            ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>::Inner_*,_unsigned_long,_bool>
              *)&local_338,&local_308,0xf4e2d492cc048d2f,&local_350,in_R8);
  if ((char)local_338.inner_ == '\x01') {
    if (*(slot_type **)((long)local_338.it_.ctrl_ + 8) == (slot_type *)0x0) goto LAB_001243a6;
    psVar1 = *(slot_type **)((long)local_338.it_.ctrl_ + 8) + (long)local_338.inner_end_;
    psVar1->key = 5;
    psVar1->value = 0xd;
    raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
                *)local_338.it_.ctrl_,(size_t)local_338.inner_end_,'/');
  }
  else {
    (*(slot_type **)((long)local_338.it_.ctrl_ + 8))[(long)local_338.inner_end_].value = 6;
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::find<phmap::priv::(anonymous_namespace)::Entry>
            (&local_338,&local_308,
             (key_arg<phmap::priv::(anonymous_namespace)::Entry> *)&stack0xfffffffffffffca8);
  mutexlock = (UniqueLock *)&local_33c;
  local_33c = 0xd;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_350,"m.find(Entry{5})->value","13",
             &(local_338.it_.field_1.slot_)->value,(int *)mutexlock);
  if ((char)local_350.key == '\0') {
    testing::Message::Message((Message *)&local_338);
    if (local_348 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      mutexlock = (UniqueLock *)0x22d19f;
    }
    else {
      mutexlock = (UniqueLock *)(local_348->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffca8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x4f,(char *)mutexlock);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffca8,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffca8);
    if (local_338.inner_ != (Inner *)0x0) {
      (**(code **)(((local_338.inner_)->set_).ctrl_ + 8))();
    }
  }
  if (local_348 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_348,local_348);
  }
  local_350.key = 5;
  local_350.value = 0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::find_or_prepare_insert_with_hash<phmap::priv::(anonymous_namespace)::Entry>
            ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>::Inner_*,_unsigned_long,_bool>
              *)&local_338,&local_308,0xf4e2d492cc048d2f,&local_350,mutexlock);
  if ((char)local_338.inner_ == '\x01') {
    if (*(slot_type **)((long)local_338.it_.ctrl_ + 8) == (slot_type *)0x0) {
LAB_001243a6:
      __assert_fail("*slot_",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x5ee,
                    "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous namespace)::Entry>, phmap::Hash<phmap::priv::(anonymous namespace)::Entry>, phmap::EqualTo<phmap::priv::(anonymous namespace)::Entry>, std::allocator<phmap::priv::(anonymous namespace)::Entry>>::constructor::operator()(Args &&...) const [Policy = phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous namespace)::Entry>, Hash = phmap::Hash<phmap::priv::(anonymous namespace)::Entry>, Eq = phmap::EqualTo<phmap::priv::(anonymous namespace)::Entry>, Alloc = std::allocator<phmap::priv::(anonymous namespace)::Entry>, Args = <int, int>]"
                   );
    }
    psVar1 = *(slot_type **)((long)local_338.it_.ctrl_ + 8) + (long)local_338.inner_end_;
    psVar1->key = 5;
    psVar1->value = 0xd;
    raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
                *)local_338.it_.ctrl_,(size_t)local_338.inner_end_,'/');
  }
  else {
    (*(slot_type **)((long)local_338.it_.ctrl_ + 8))[(long)local_338.inner_end_].value = 6;
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::find<phmap::priv::(anonymous_namespace)::Entry>
            (&local_338,&local_308,
             (key_arg<phmap::priv::(anonymous_namespace)::Entry> *)&stack0xfffffffffffffca8);
  local_33c = 6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_350,"m.find(Entry{5})->value","6",
             &(local_338.it_.field_1.slot_)->value,&local_33c);
  if ((char)local_350.key == '\0') {
    testing::Message::Message((Message *)&local_338);
    if (local_348 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_348->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffca8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x55,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffca8,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffca8);
    if (local_338.inner_ != (Inner *)0x0) {
      (**(code **)(((local_338.inner_)->set_).ctrl_ + 8))();
    }
  }
  if (local_348 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_348,local_348);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::~parallel_hash_set(&local_308);
  return;
}

Assistant:

Entry(int k, int v=0) : key(k), value(v) {}